

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  ClauseAllocator *this_00;
  long lVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint cr;
  Lit *pLVar6;
  uint uVar7;
  ostream *poVar8;
  long lVar9;
  bool bVar10;
  size_t k;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  Lit smallest;
  
  if (3 < *(int *)(this + 0xf8)) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ");
    poVar8 = operator<<(poVar8,cls);
    std::endl<char,std::char_traits<char>>(poVar8);
    printState(this);
  }
  bVar10 = true;
  if ((cls->sz != 0) && (*this == (OnlineProofChecker)0x1)) {
    if (cls->sz == 1) {
      uVar7 = *(uint *)(this + 0x38);
      lVar9 = *(long *)(this + 0x30);
      uVar13 = 0;
      uVar12 = 0;
      if (0 < (int)uVar7) {
        uVar13 = (ulong)uVar7;
      }
      do {
        if (uVar13 == uVar12) goto LAB_0010a769;
        uVar11 = uVar12 + 1;
        lVar1 = uVar12 * 4;
        uVar12 = uVar11;
      } while (*(int *)(lVar9 + lVar1) != cls->data->x);
      *(undefined4 *)(lVar9 + -4 + uVar11 * 4) = *(undefined4 *)(lVar9 + -4 + (long)(int)uVar7 * 4);
      *(int *)(this + 0x38) = *(int *)(this + 0x38) + -1;
      if (1 < *(int *)(this + 0xf8)) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
        poVar8 = operator<<(poVar8,cls);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    else {
      MarkArray::nextStep((MarkArray *)(this + 0x90));
      pLVar6 = cls->data;
      iVar4 = *(int *)(this + 0xa8);
      lVar9 = *(long *)(this + 0x90);
      *(int *)(lVar9 + (ulong)(uint)pLVar6->x * 4) = iVar4;
      lVar1 = *(long *)(this + 0x40);
      uVar7 = 0;
      lVar14 = 1;
      while( true ) {
        uVar5 = cls->sz;
        if ((int)uVar5 <= lVar14) break;
        *(int *)(lVar9 + (ulong)(uint)pLVar6[lVar14].x * 4) = iVar4;
        lVar17 = (long)pLVar6[lVar14].x * 0x18;
        lVar16 = (long)(int)uVar7 * 0x18;
        uVar5 = (uint)lVar14;
        if ((ulong)(*(long *)(lVar1 + 8 + lVar16) - *(long *)(lVar1 + lVar16)) <=
            (ulong)(*(long *)(lVar1 + 8 + lVar17) - *(long *)(lVar1 + lVar17))) {
          uVar5 = uVar7;
        }
        uVar7 = uVar5;
        lVar14 = lVar14 + 1;
      }
      smallest.x = pLVar6[(int)uVar7].x;
      lVar15 = (long)smallest.x * 0x18;
      lVar14 = *(long *)(lVar1 + lVar15);
      lVar16 = *(long *)(lVar1 + 8 + lVar15);
      lVar17 = lVar16 - lVar14;
      this_00 = (ClauseAllocator *)(this + 8);
      for (lVar18 = 0; lVar18 != lVar17 >> 2; lVar18 = lVar18 + 1) {
        cr = *(uint *)(lVar14 + lVar18 * 4);
        uVar12 = (ulong)cr;
        if (uVar5 == (uint)((ulong)*(undefined8 *)(*(long *)(this + 8) + uVar12 * 4) >> 0x22)) {
          uVar13 = 0;
          do {
            if (uVar5 == uVar13) {
              *(undefined4 *)(lVar14 + lVar18 * 4) = *(undefined4 *)(lVar14 + -4 + lVar17);
              lVar16 = lVar16 + -4;
              *(long *)(lVar1 + 8 + lVar15) = lVar16;
              bVar19 = lVar16 - lVar14 != -4;
              bVar10 = cr != 0xffffffff && bVar19;
              if (cr == 0xffffffff || !bVar19) goto LAB_0010a70f;
              uVar13 = 0;
              goto LAB_0010a5a5;
            }
            lVar3 = uVar13 * 4;
            uVar13 = uVar13 + 1;
          } while (*(int *)(lVar9 + (ulong)*(uint *)(uVar12 * 4 + *(long *)(this + 8) + 8 + lVar3) *
                                    4) == iVar4);
        }
      }
LAB_0010a70f:
      if (1 < *(int *)(this + 0xf8)) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ");
        poVar8 = operator<<(poVar8,cls);
        poVar8 = std::operator<<(poVar8," from list of literal ");
        poVar8 = operator<<(poVar8,&smallest);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      printState(this);
LAB_0010a769:
      bVar10 = false;
    }
  }
  return bVar10;
LAB_0010a5a5:
  if ((long)cls->sz <= (long)uVar13) {
    detachClause(this,cr);
    *(ulong *)(*(long *)(this + 8) + uVar12 * 4) =
         (*(ulong *)(*(long *)(this + 8) + uVar12 * 4) & 0xfffffffffffffffc) + 1;
    ClauseAllocator::free(this_00,(void *)(ulong)cr);
    if (*(int *)(this + 0xf8) < 2) {
      return bVar10;
    }
    poVar8 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
    poVar8 = operator<<(poVar8,cls);
    poVar8 = std::operator<<(poVar8," which is internally ");
    poVar8 = operator<<(poVar8,(Clause *)(uVar12 * 4 + *(long *)this_00));
    std::endl<char,std::char_traits<char>>(poVar8);
    return bVar10;
  }
  if (uVar13 != uVar7) {
    lVar9 = *(long *)(this + 0x40);
    lVar14 = (long)cls->data[uVar13].x * 0x18;
    plVar2 = (long *)(lVar9 + lVar14);
    lVar1 = *(long *)(lVar9 + lVar14);
    lVar9 = *(long *)(lVar9 + 8 + lVar14);
    lVar14 = lVar9 - lVar1;
    for (lVar16 = 0; lVar14 >> 2 != lVar16; lVar16 = lVar16 + 1) {
      if (*(uint *)(lVar1 + lVar16 * 4) == cr) {
        *(undefined4 *)(lVar1 + lVar16 * 4) = *(undefined4 *)(lVar1 + -4 + lVar14);
        lVar9 = lVar9 + -4;
        plVar2[1] = lVar9;
        if (lVar9 - lVar1 != -4) goto LAB_0010a707;
        break;
      }
    }
    if (1 < *(int *)(this + 0xf8)) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"c could not remove clause ");
      poVar8 = operator<<(poVar8,cls);
      poVar8 = std::operator<<(poVar8," from list of literal ");
      poVar8 = operator<<(poVar8,cls->data + uVar13);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    printState(this);
    if (2 < *(int *)(this + 0xf8)) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"c list for ");
      poVar8 = operator<<(poVar8,cls->data + uVar13);
      std::operator<<(poVar8," : ");
      for (uVar11 = 0; uVar11 < (ulong)(plVar2[1] - *plVar2 >> 2); uVar11 = uVar11 + 1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"c ");
        poVar8 = operator<<(poVar8,(Clause *)
                                   ((ulong)*(uint *)(*plVar2 + uVar11 * 4) * 4 + *(long *)this_00));
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
  }
LAB_0010a707:
  uVar13 = uVar13 + 1;
  goto LAB_0010a5a5;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}